

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

cmListFileBacktrace * __thiscall
cmListFileBacktrace::Push
          (cmListFileBacktrace *__return_storage_ptr__,cmListFileBacktrace *this,string *file)

{
  cmListFileContext lfc;
  undefined1 local_58 [32];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  long local_18;
  
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = 0;
  local_58[0x10] = '\0';
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_18 = 0;
  std::__cxx11::string::_M_assign((string *)&local_38);
  cmListFileBacktrace(__return_storage_ptr__,&this->Bottom,this->Cur,(cmListFileContext *)local_58);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_58);
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(std::string const& file) const
{
  // We are entering a file-level scope but have not yet reached
  // any specific line or command invocation within it.  This context
  // is useful to print when it is at the top but otherwise can be
  // skipped during call stack printing.
  cmListFileContext lfc;
  lfc.FilePath = file;
  return cmListFileBacktrace(this->Bottom, this->Cur, lfc);
}